

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCanon.c
# Opt level: O1

int Map_CanonComputeFast
              (Map_Man_t *p,int nVarsMax,int nVarsReal,uint *uTruth,uchar *puPhases,uint *uTruthRes)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  unsigned_short *puVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  
  if (nVarsMax == 6) {
    iVar6 = Map_CanonComputeSlow(p->uTruths,6,nVarsReal,uTruth,puPhases,uTruthRes);
    return iVar6;
  }
  if (nVarsReal < 5) {
    uVar2 = (ushort)*uTruth;
    if (p->pCounters[uVar2] < '\x01') {
      __assert_fail("p->pCounters[uTruth0] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xbc,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    uVar9 = CONCAT22(p->uCanons[uVar2],p->uCanons[uVar2]);
    *uTruthRes = uVar9;
    uTruthRes[1] = uVar9;
    *puPhases = *p->uPhases[uVar2];
  }
  else {
    if (nVarsMax != 5) {
      __assert_fail("nVarsMax == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xc3,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    if (nVarsReal != 5) {
      __assert_fail("nVarsReal == 5",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                    ,0xc4,
                    "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                   );
    }
    uVar9 = *uTruth;
    uVar13 = uVar9 & 0xffff;
    if (uVar9 < 0x10000) {
      uVar2 = p->uCanons[uVar13];
      *uTruthRes = (uint)uVar2;
      uTruthRes[1] = (uint)uVar2;
      cVar1 = p->pCounters[uVar13];
      cVar5 = '\x04';
      if (cVar1 < '\x04') {
        cVar5 = cVar1;
      }
      uVar9 = (uint)cVar5;
      if (cVar1 < '\x01') {
        return uVar9;
      }
      uVar10 = 0;
      do {
        puPhases[uVar10] = p->uPhases[uVar13][uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
      return uVar9;
    }
    uVar9 = uVar9 >> 0x10;
    puVar4 = p->uCanons;
    if (uVar13 == 0) {
      uVar2 = puVar4[uVar9];
      *uTruthRes = (uint)uVar2;
      uTruthRes[1] = (uint)uVar2;
      cVar1 = p->pCounters[uVar9];
      cVar5 = '\x04';
      if (cVar1 < '\x04') {
        cVar5 = cVar1;
      }
      uVar13 = (uint)cVar5;
      if (cVar1 < '\x01') {
        return uVar13;
      }
      uVar10 = 0;
      do {
        puPhases[uVar10] = p->uPhases[uVar9][uVar10] | 0x10;
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
      return uVar13;
    }
    uVar2 = puVar4[uVar13];
    uVar3 = puVar4[uVar9];
    if (uVar2 < uVar3) {
      if (p->pCounters[uVar13] < '\x01') {
        __assert_fail("p->pCounters[uTruth0] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                      ,0xf3,
                      "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                     );
      }
      if (p->pCounters[uVar13] < '\x01') {
        bVar12 = 0x10;
        uVar8 = 0xffffffff;
      }
      else {
        uVar8 = 0xffffffff;
        bVar12 = 0x10;
        lVar11 = 0;
        do {
          uVar7 = Extra_TruthPolarize(uVar9,(int)p->uPhases[uVar13][lVar11],4);
          if ((uVar7 < uVar8) && (bVar12 = p->uPhases[uVar13][lVar11], uVar8 = uVar7, 0xf < bVar12))
          {
            __assert_fail("uPhaseBest < 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                          ,0xfc,
                          "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                         );
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->pCounters[uVar13]);
        bVar12 = bVar12 | 0x10;
      }
      uVar8 = (uint)uVar2 << 0x10 | uVar8;
      *uTruthRes = uVar8;
      uTruthRes[1] = uVar8;
    }
    else {
      if (p->pCounters[uVar9] < '\x01') {
        __assert_fail("p->pCounters[uTruth1] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                      ,0xe0,
                      "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                     );
      }
      if (p->pCounters[uVar9] < '\x01') {
        bVar12 = 0x10;
        uVar8 = 0xffffffff;
      }
      else {
        uVar8 = 0xffffffff;
        bVar12 = 0x10;
        lVar11 = 0;
        do {
          uVar7 = Extra_TruthPolarize(uVar13,(int)p->uPhases[uVar9][lVar11],4);
          if ((uVar7 < uVar8) && (bVar12 = p->uPhases[uVar9][lVar11], uVar8 = uVar7, 0xf < bVar12))
          {
            __assert_fail("uPhaseBest < 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCanon.c"
                          ,0xe9,
                          "int Map_CanonComputeFast(Map_Man_t *, int, int, unsigned int *, unsigned char *, unsigned int *)"
                         );
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < p->pCounters[uVar9]);
      }
      uVar8 = (uint)uVar3 << 0x10 | uVar8;
      *uTruthRes = uVar8;
      uTruthRes[1] = uVar8;
    }
    *puPhases = bVar12;
  }
  return 1;
}

Assistant:

int Map_CanonComputeFast( Map_Man_t * p, int nVarsMax, int nVarsReal, unsigned uTruth[], unsigned char * puPhases, unsigned uTruthRes[] )
{
    unsigned uTruth0, uTruth1;
    unsigned uCanon0, uCanon1, uCanonBest;
    unsigned uPhaseBest = 16; // Suppress "might be used uninitialized" (asserts require < 16)
    int i, Limit;

    if ( nVarsMax == 6 )
        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );

    if ( nVarsReal < 5 )
    {
//        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );

        uTruth0 = uTruth[0] & 0xFFFF;
        assert( p->pCounters[uTruth0] > 0 );
        uTruthRes[0] = (p->uCanons[uTruth0] << 16) | p->uCanons[uTruth0];
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = p->uPhases[uTruth0][0];
        return 1;
    }

    assert( nVarsMax == 5 );
    assert( nVarsReal == 5 );
    uTruth0 = uTruth[0] & 0xFFFF;
    uTruth1 = (uTruth[0] >> 16);
    if ( uTruth1 == 0 )
    {
        uTruthRes[0] = p->uCanons[uTruth0];
        uTruthRes[1] = uTruthRes[0];
        Limit = (p->pCounters[uTruth0] > 4)? 4 : p->pCounters[uTruth0];
        for ( i = 0; i < Limit; i++ )
            puPhases[i] = p->uPhases[uTruth0][i];
        return Limit;
    }
    else if ( uTruth0 == 0 )
    {
        uTruthRes[0] = p->uCanons[uTruth1];
        uTruthRes[1] = uTruthRes[0];
        Limit = (p->pCounters[uTruth1] > 4)? 4 : p->pCounters[uTruth1];
        for ( i = 0; i < Limit; i++ )
        {
            puPhases[i] = p->uPhases[uTruth1][i];
            puPhases[i] |= (1 << 4);
        }
        return Limit;
    }
    uCanon0 = p->uCanons[uTruth0];
    uCanon1 = p->uCanons[uTruth1];
    if ( uCanon0 >= uCanon1 ) // using nCanon1 as the main one
    {
        assert( p->pCounters[uTruth1] > 0 );
        uCanonBest = 0xFFFFFFFF;
        for ( i = 0; i < p->pCounters[uTruth1]; i++ )
        {
            uCanon0 = Extra_TruthPolarize( uTruth0, p->uPhases[uTruth1][i], 4 );
            if ( uCanonBest > uCanon0 )
            {
                uCanonBest = uCanon0;
                uPhaseBest = p->uPhases[uTruth1][i];
                assert( uPhaseBest < 16 );
            }
        }
        uTruthRes[0] = (uCanon1 << 16) | uCanonBest;
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = uPhaseBest;
        return 1;
    }
    else if ( uCanon0 < uCanon1 )
    {
        assert( p->pCounters[uTruth0] > 0 );
        uCanonBest = 0xFFFFFFFF;
        for ( i = 0; i < p->pCounters[uTruth0]; i++ )
        {
            uCanon1 = Extra_TruthPolarize( uTruth1, p->uPhases[uTruth0][i], 4 );
            if ( uCanonBest > uCanon1 )
            {
                uCanonBest = uCanon1;
                uPhaseBest = p->uPhases[uTruth0][i];
                assert( uPhaseBest < 16 );
            }
        }
        uTruthRes[0] = (uCanon0 << 16) | uCanonBest;
        uTruthRes[1] = uTruthRes[0];
        puPhases[0] = uPhaseBest | (1 << 4);
        return 1;
    }
    else
    {
        assert( 0 );
        return Map_CanonComputeSlow( p->uTruths, nVarsMax, nVarsReal, uTruth, puPhases, uTruthRes );
    }
}